

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Bool InsertMisc(Node *element,Node *node)

{
  NodeType NVar1;
  Node *pNVar2;
  Dict *pDVar3;
  Bool BVar4;
  Node **ppNVar5;
  Node *pNVar6;
  Node **ppNVar7;
  
  NVar1 = node->type;
  if (NVar1 < (PhpTag|CommentTag)) {
    if ((0x1f0cU >> (NVar1 & 0x1f) & 1) == 0) {
      pNVar2 = element;
      if (NVar1 == XmlDecl) {
        do {
          pNVar6 = pNVar2;
          if (pNVar6 == (Node *)0x0) goto LAB_0013eaec;
          pNVar2 = pNVar6->parent;
        } while (pNVar6->parent != (Node *)0x0);
        pNVar2 = pNVar6->content;
        if (pNVar2 == (Node *)0x0) {
          node->parent = pNVar6;
LAB_0013eb3a:
          ppNVar7 = &pNVar6->last;
        }
        else {
          if (pNVar2->type == XmlDecl) goto LAB_0013eaec;
          node->parent = pNVar6;
          if (pNVar2 == (Node *)0x0) goto LAB_0013eb3a;
          ppNVar7 = &pNVar2->prev;
        }
        ppNVar5 = &pNVar6->content;
        *ppNVar7 = node;
        node->next = pNVar2;
        node->prev = (Node *)0x0;
        goto LAB_0013eab6;
      }
      goto LAB_0013eaec;
    }
  }
  else {
LAB_0013eaec:
    if (node->tag == (Dict *)0x0) {
      return no;
    }
    BVar4 = prvTidynodeIsElement(node);
    if (BVar4 == no) {
      return no;
    }
    BVar4 = prvTidynodeCMIsEmpty(node);
    if (BVar4 == no) {
      return no;
    }
    pDVar3 = node->tag;
    if ((pDVar3 != (Dict *)0x0) && (pDVar3->id != TidyTag_UNKNOWN)) {
      return no;
    }
    if ((pDVar3->versions & 0xe000) == 0) {
      return no;
    }
  }
  node->parent = element;
  ppNVar5 = &element->last;
  pNVar2 = element->last;
  node->prev = pNVar2;
  ppNVar7 = &element->content;
  if (pNVar2 != (Node *)0x0) {
    ppNVar7 = &pNVar2->next;
  }
  *ppNVar7 = node;
LAB_0013eab6:
  *ppNVar5 = node;
  return yes;
}

Assistant:

static Bool InsertMisc(Node *element, Node *node)
{
    if (node->type == CommentTag ||
        node->type == ProcInsTag ||
        node->type == CDATATag ||
        node->type == SectionTag ||
        node->type == AspTag ||
        node->type == JsteTag ||
        node->type == PhpTag )
    {
        TY_(InsertNodeAtEnd)(element, node);
        return yes;
    }

    if ( node->type == XmlDecl )
    {
        Node* root = element;
        while ( root && root->parent )
            root = root->parent;
        if ( root && !(root->content && root->content->type == XmlDecl))
        {
          TY_(InsertNodeAtStart)( root, node );
          return yes;
        }
    }

    /* Declared empty tags seem to be slipping through
    ** the cracks.  This is an experiment to figure out
    ** a decent place to pick them up.
    */
    if ( node->tag &&
         TY_(nodeIsElement)(node) &&
         TY_(nodeCMIsEmpty)(node) && TagId(node) == TidyTag_UNKNOWN &&
         (node->tag->versions & VERS_PROPRIETARY) != 0 )
    {
        TY_(InsertNodeAtEnd)(element, node);
        return yes;
    }

    return no;
}